

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

shared_ptr<ASTNode> __thiscall SchemeObject::to_AST(SchemeObject *this)

{
  eval_error *this_00;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SchemeObject *this_local;
  
  this_local = this;
  this_00 = (eval_error *)__cxa_allocate_exception(0x10);
  (**(code **)(*in_RSI + 0x10))(&local_58);
  std::operator+(&local_38,"Cannot evaluate ",&local_58);
  eval_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&eval_error::typeinfo,eval_error::~eval_error);
}

Assistant:

std::shared_ptr<ASTNode> SchemeObject::to_AST() const
{
    throw eval_error("Cannot evaluate " + external_repr());
}